

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

cni_holder_base *
cs_impl::cni::construct_helper<bool(*)()>::_construct<bool(&)(),bool>
          (_func_bool *val,_func_bool *target_function)

{
  cni_holder<bool_(*)(),_bool_(*)()> *this;
  _func_bool *local_18;
  
  this = (cni_holder<bool_(*)(),_bool_(*)()> *)operator_new(0x28);
  local_18 = val;
  cni_holder<bool_(*)(),_bool_(*)()>::cni_holder(this,&local_18);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}